

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O0

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,int q,int p)

{
  bool bVar1;
  bool bVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  realtype tol;
  MRIStepCoupling MRIC;
  MRISTEP_METHOD_TYPE type;
  realtype ***C;
  realtype Asum;
  int padding;
  int stages;
  int j;
  int i;
  int local_54;
  undefined8 in_stack_ffffffffffffffb8;
  realtype ***local_38;
  double local_30;
  int local_20;
  int local_1c;
  MRIStepCoupling local_8;
  
  if (in_RDI == 0) {
    local_8 = (MRIStepCoupling)0x0;
  }
  else {
    local_30 = ABS(**(double **)(in_RDI + 0x18));
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
      local_30 = ABS(*(double *)(**(long **)(in_RDI + 0x10) + (long)local_20 * 8)) + local_30;
    }
    if (local_30 <= 2.220446049250313e-14) {
      if (*(double *)(*(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 8) + -1) * 8) <=
          1.0000000000000222) {
        for (local_20 = 1; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
          if (*(double *)(*(long *)(in_RDI + 0x18) + (long)local_20 * 8) -
              *(double *)(*(long *)(in_RDI + 0x18) + (long)(local_20 + -1) * 8) <
              -2.220446049250313e-14) {
            return (MRIStepCoupling)0x0;
          }
        }
        local_30 = 0.0;
        for (local_1c = 0; local_20 = local_1c, local_1c < *(int *)(in_RDI + 8);
            local_1c = local_1c + 1) {
          while (local_20 = local_20 + 1, local_20 < *(int *)(in_RDI + 8)) {
            local_30 = ABS(*(double *)
                            (*(long *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 8) +
                            (long)local_20 * 8)) + local_30;
          }
        }
        if (local_30 <= 2.220446049250313e-14) {
          bVar1 = 2.220446049250313e-14 <
                  ABS(*(double *)(*(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 8) + -1) * 8)
                      - 1.0);
          for (local_20 = 0; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
            if (2.220446049250313e-14 <
                ABS(*(double *)
                     (*(long *)(*(long *)(in_RDI + 0x10) + (long)(*(int *)(in_RDI + 8) + -1) * 8) +
                     (long)local_20 * 8) -
                    *(double *)(*(long *)(in_RDI + 0x20) + (long)local_20 * 8))) {
              bVar1 = true;
            }
          }
          if (bVar1) {
            local_54 = *(int *)(in_RDI + 8) + 1;
          }
          else {
            local_54 = *(int *)(in_RDI + 8);
          }
          bVar2 = false;
          for (local_1c = 0; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
            for (local_20 = local_1c; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
              if (2.220446049250313e-14 <
                  ABS(*(double *)
                       (*(long *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 8) +
                       (long)local_20 * 8))) {
                bVar2 = true;
              }
            }
          }
          local_8 = MRIStepCoupling_Alloc
                              ((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                               (int)in_stack_ffffffffffffffb8,0x3d190000);
          if (local_8 == (MRIStepCoupling)0x0) {
            local_8 = (MRIStepCoupling)0x0;
          }
          else {
            local_8->q = in_ESI;
            local_8->p = in_EDX;
            for (local_1c = 0; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
              local_8->c[local_1c] = *(realtype *)(*(long *)(in_RDI + 0x18) + (long)local_1c * 8);
            }
            if (bVar1) {
              local_8->c[local_54 + -1] = 1.0;
            }
            if (bVar2) {
              local_38 = local_8->G;
            }
            else {
              local_38 = local_8->W;
            }
            for (local_1c = 0; local_1c < local_54; local_1c = local_1c + 1) {
              for (local_20 = 0; local_20 < local_54; local_20 = local_20 + 1) {
                (*local_38)[local_1c][local_20] = 0.0;
              }
            }
            for (local_1c = 1; local_1c < *(int *)(in_RDI + 8); local_1c = local_1c + 1) {
              for (local_20 = 0; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
                (*local_38)[local_1c][local_20] =
                     *(double *)
                      (*(long *)(*(long *)(in_RDI + 0x10) + (long)local_1c * 8) + (long)local_20 * 8
                      ) - *(double *)
                           (*(long *)(*(long *)(in_RDI + 0x10) + (long)(local_1c + -1) * 8) +
                           (long)local_20 * 8);
              }
            }
            if (bVar1) {
              for (local_20 = 0; local_20 < *(int *)(in_RDI + 8); local_20 = local_20 + 1) {
                (*local_38)[local_54 + -1][local_20] =
                     *(double *)(*(long *)(in_RDI + 0x20) + (long)local_20 * 8) -
                     *(double *)
                      (*(long *)(*(long *)(in_RDI + 0x10) + (long)(*(int *)(in_RDI + 8) + -1) * 8) +
                      (long)local_20 * 8);
              }
            }
          }
        }
        else {
          local_8 = (MRIStepCoupling)0x0;
        }
      }
      else {
        local_8 = (MRIStepCoupling)0x0;
      }
    }
    else {
      local_8 = (MRIStepCoupling)0x0;
    }
  }
  return local_8;
}

Assistant:

MRIStepCoupling MRIStepCoupling_MIStoMRI(ARKodeButcherTable B,
                                         int q, int p)
{
  int i, j, stages;
  booleantype padding;
  realtype Asum;
  realtype ***C;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRIC;

  const realtype tol = RCONST(100.0) * UNIT_ROUNDOFF;

  /* Check that input table is non-NULL */
  if (!B) return(NULL);

  /* -----------------------------------
   * Check that the input table is valid
   * ----------------------------------- */

  /* First stage is just old solution */
  Asum = SUNRabs(B->c[0]);
  for (j=0; j<B->stages; j++)
    Asum += SUNRabs(B->A[0][j]);
  if (Asum > tol) return(NULL);

  /* Last stage exceeds 1 */
  if (B->c[B->stages-1] > ONE+tol) return(NULL);

  /* All stages are sorted */
  for (j=1; j<B->stages; j++)
    if ((B->c[j] - B->c[j-1]) < -tol) return(NULL);

  /* Each stage at most diagonally implicit */
  Asum = ZERO;
  for (i=0; i<B->stages; i++)
    for (j=i+1; j<B->stages; j++)
      Asum += SUNRabs(B->A[i][j]);
  if (Asum > tol) return(NULL);

  /* -----------------------------------------
   * determine whether the table needs padding
   * ----------------------------------------- */

  padding = SUNFALSE;

  /* Last stage time should equal 1 */
  if (SUNRabs(B->c[B->stages-1] - ONE) > tol)
    padding = SUNTRUE;

  /* Last row of A should equal b */
  for (j=0; j<B->stages; j++) {
    if (SUNRabs(B->A[B->stages-1][j] - B->b[j]) > tol)
      padding = SUNTRUE;
  }
  stages = (padding) ? B->stages+1 : B->stages;

  /* -------------------------
   * determine the method type
   * ------------------------- */

  /* Check if the table is strictly lower triangular (explicit) */
  type = MRISTEP_EXPLICIT;

  for (i=0; i<B->stages; i++)
    for (j=i; j<B->stages; j++)
      if (SUNRabs(B->A[i][j]) > tol)
        type = MRISTEP_IMPLICIT;

  /* ----------------------------
   * construct coupling structure
   * ---------------------------- */

  MRIC = MRIStepCoupling_Alloc(1, stages, type);
  if (!MRIC) return(NULL);

  /* Copy method/embedding orders */
  MRIC->q = q;
  MRIC->p = p;

  /* Copy abscissae, padding if needed */
  for (i=0; i<B->stages; i++)
    MRIC->c[i] = B->c[i];

  if (padding)
    MRIC->c[stages-1] = ONE;

  /* Construct the coupling table */
  if (type == MRISTEP_EXPLICIT)
    C = MRIC->W;
  else
    C = MRIC->G;

  /* First row is identically zero */
  for (i=0; i<stages; i++)
    for (j=0; j<stages; j++)
      C[0][i][j] = ZERO;

  /* Remaining rows = A(2:end,:) - A(1:end-1,:) */
  for (i=1; i<B->stages; i++)
    for (j=0; j<B->stages; j++)
      C[0][i][j] = B->A[i][j] - B->A[i-1][j];

  /* Padded row = b(:) - A(end,:) */
  if (padding)
    for (j=0; j<B->stages; j++)
      C[0][stages-1][j] = B->b[j] - B->A[B->stages-1][j];

  return(MRIC);
}